

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputState xVar2;
  bool bVar3;
  unsigned_long uVar4;
  xmlType xVar5;
  long lVar6;
  xmlChar *pxVar7;
  void *pvVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  xmlChar xVar12;
  xmlParserErrors error;
  xmlParserInputPtr pxVar13;
  ulong uVar14;
  ulong local_38;
  
  if (ctxt->instate == XML_PARSER_EOF) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (void *)0x0;
    local_38 = 0;
    uVar11 = 0;
    do {
      xVar5 = ctxt->mlType;
      pxVar13 = ctxt->input;
      if (xVar5 == XML_TYPE_SML) {
        pxVar7 = pxVar13->cur;
        bVar3 = true;
        if ((*pxVar7 == '!') && (pxVar7[1] == '[')) {
          lVar6 = 2;
          iVar9 = 2;
          goto LAB_001636df;
        }
LAB_001637cc:
        pxVar7 = pxVar13->cur;
        if (((uVar11 == 0) || ((*pxVar7 != ']' || (pxVar7[1] != ']')))) ||
           ((!bVar3 && (pxVar7[2] != '>')))) {
          uVar4 = pxVar13->consumed;
          xmlParseMarkupDecl(ctxt);
          if ((ctxt->input->cur == pxVar7) && ((ulong)(uint)uVar4 == ctxt->input->consumed)) {
            error = XML_ERR_EXT_SUBSET_NOT_FINISHED;
            goto LAB_00163b33;
          }
        }
        else {
          if (pxVar13->id != *(int *)((long)pvVar10 + uVar11 * 4 + -4)) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
            xVar5 = ctxt->mlType;
            pxVar13 = ctxt->input;
            pxVar7 = pxVar13->cur;
          }
          uVar11 = uVar11 - 1;
          pxVar13->cur = pxVar7 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
          pxVar13->col = (uint)(xVar5 == XML_TYPE_XML) + pxVar13->col + 2;
          if (pxVar7[(ulong)(xVar5 == XML_TYPE_XML) + 2] != '\0') goto LAB_00163862;
LAB_00163abb:
          xmlParserInputGrow(pxVar13,0xfa);
        }
      }
      else {
        if ((((xVar5 != XML_TYPE_XML) || (pxVar7 = pxVar13->cur, *pxVar7 != '<')) ||
            (pxVar7[1] != '!')) || (pxVar7[2] != '[')) {
          bVar3 = false;
          goto LAB_001637cc;
        }
        lVar6 = 3;
        iVar9 = 3;
LAB_001636df:
        iVar1 = pxVar13->id;
        pxVar13->cur = pxVar7 + lVar6;
        pxVar13->col = pxVar13->col + iVar9;
        if (pxVar7[lVar6] == '\0') {
          xmlParserInputGrow(pxVar13,0xfa);
        }
        xmlSkipBlankChars(ctxt);
        pxVar13 = ctxt->input;
        pxVar7 = pxVar13->cur;
        if (*pxVar7 != 'I') {
LAB_00163b0b:
          error = XML_ERR_CONDSEC_INVALID_KEYWORD;
LAB_00163b33:
          xmlFatalErr(ctxt,error,(char *)0x0);
          xmlHaltParser(ctxt);
          break;
        }
        if (pxVar7[1] == 'G') {
          if ((((pxVar7[2] != 'N') || (pxVar7[3] != 'O')) || (pxVar7[4] != 'R')) ||
             (pxVar7[5] != 'E')) goto LAB_00163b0b;
          pxVar13->cur = pxVar7 + 6;
          pxVar13->col = pxVar13->col + 6;
          if (pxVar7[6] == '\0') {
            xmlParserInputGrow(pxVar13,0xfa);
          }
          xmlSkipBlankChars(ctxt);
          if (*ctxt->input->cur != '[') goto LAB_00163b2b;
          if (ctxt->input->id != iVar1) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
          }
          xmlNextChar(ctxt);
          xVar2 = ctxt->instate;
          iVar9 = ctxt->disableSAX;
          if (ctxt->recovery == 0) {
            ctxt->disableSAX = 1;
          }
          ctxt->instate = XML_PARSER_IGNORE;
          pxVar13 = ctxt->input;
          pxVar7 = pxVar13->cur;
          xVar12 = *pxVar7;
          if (xVar12 != '\0') {
            lVar6 = 0;
            do {
              xVar5 = ctxt->mlType;
              if (xVar12 == '<' && xVar5 == XML_TYPE_XML) {
                if ((pxVar7[1] != '!') || (pxVar7[2] != '[')) goto LAB_00163a48;
LAB_001639c7:
                pxVar13->cur = pxVar7 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
                pxVar13->col = pxVar13->col + (uint)(xVar5 == XML_TYPE_XML) + 2;
                if (pxVar7[(ulong)(xVar5 == XML_TYPE_XML) + 2] == '\0') {
                  xmlParserInputGrow(pxVar13,0xfa);
                }
                lVar6 = lVar6 + 1;
                if (lVar6 == 0) goto LAB_00163b1f;
              }
              else {
                if (xVar12 == '!' && xVar5 == XML_TYPE_SML) {
                  if (pxVar7[1] == '[') goto LAB_001639c7;
                }
                else if (((xVar12 == ']') && (pxVar7[1] == ']')) &&
                        ((xVar5 == XML_TYPE_SML || (pxVar7[2] == '>')))) {
                  if (lVar6 != 0) {
                    pxVar13->cur = pxVar7 + (ulong)(xVar5 == XML_TYPE_XML) + 2;
                    pxVar13->col = pxVar13->col + (uint)(xVar5 == XML_TYPE_XML) + 2;
                    if (pxVar7[(ulong)(xVar5 == XML_TYPE_XML) + 2] == '\0') {
                      xmlParserInputGrow(pxVar13,0xfa);
                    }
                    lVar6 = lVar6 + -1;
                    goto LAB_00163a50;
                  }
                  break;
                }
LAB_00163a48:
                xmlNextChar(ctxt);
              }
LAB_00163a50:
              pxVar13 = ctxt->input;
              pxVar7 = pxVar13->cur;
              xVar12 = *pxVar7;
            } while (xVar12 != '\0');
          }
          ctxt->disableSAX = iVar9;
          ctxt->instate = xVar2;
          if (*pxVar7 == '\0') {
            xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
            break;
          }
          if (pxVar13->id != iVar1) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
            pxVar13 = ctxt->input;
          }
          pxVar7 = pxVar13->cur;
          pxVar13->cur = pxVar7 + 3;
          pxVar13->col = pxVar13->col + 3;
          if (pxVar7[3] == '\0') goto LAB_00163abb;
        }
        else {
          if ((((pxVar7[1] != 'N') || (pxVar7[2] != 'C')) || (pxVar7[3] != 'L')) ||
             (((pxVar7[4] != 'U' || (pxVar7[5] != 'D')) || (pxVar7[6] != 'E')))) goto LAB_00163b0b;
          pxVar13->cur = pxVar7 + 7;
          pxVar13->col = pxVar13->col + 7;
          if (pxVar7[7] == '\0') {
            xmlParserInputGrow(pxVar13,0xfa);
          }
          xmlSkipBlankChars(ctxt);
          if (*ctxt->input->cur != '[') {
LAB_00163b2b:
            error = XML_ERR_CONDSEC_INVALID;
            goto LAB_00163b33;
          }
          if (ctxt->input->id != iVar1) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "All markup of the conditional section is not in the same entity\n");
          }
          xmlNextChar(ctxt);
          pvVar8 = pvVar10;
          if (local_38 <= uVar11) {
            uVar14 = local_38 * 2;
            if (local_38 == 0) {
              uVar14 = 4;
            }
            pvVar8 = (*xmlRealloc)(pvVar10,uVar14 * 4);
            local_38 = uVar14;
            if (pvVar8 == (void *)0x0) {
LAB_00163b1f:
              xmlErrMemory(ctxt,(char *)0x0);
              break;
            }
          }
          *(int *)((long)pvVar8 + uVar11 * 4) = iVar1;
          uVar11 = uVar11 + 1;
          pvVar10 = pvVar8;
        }
      }
LAB_00163862:
      if (uVar11 == 0) break;
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    } while (ctxt->instate != XML_PARSER_EOF);
  }
  (*xmlFree)(pvVar10);
  return;
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    DEBUG_ENTER(("xmlParseConditionalSections(%s);\n", dbgCtxt(ctxt)));

    while (ctxt->instate != XML_PARSER_EOF) {
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
            int id = ctxt->input->id;

            SKIP_MLI(3);	/* '<', '!', '[' */
            SKIP_BLANKS;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;

                    inputIdsSize = (inputIdsSize == 0 ? 4 : inputIdsSize * 2);
                    tmp = (int *) xmlRealloc(inputIds,
                            inputIdsSize * sizeof(int));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt, NULL);
                        goto error;
                    }
                    inputIds = tmp;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                int state;
                xmlParserInputState instate;
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                /*
                 * Parse up to the end of the conditional section but disable
                 * SAX event generating DTD building in the meantime
                 */
                state = ctxt->disableSAX;
                instate = ctxt->instate;
                if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                ctxt->instate = XML_PARSER_IGNORE;

                while (RAW != 0) {
                    if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
                        SKIP_MLI(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt, NULL);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (ISSML || (NXT(2) == '>'))) {
                        if (ignoreDepth == 0)
                            break;
                        SKIP_MLI(3);
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                ctxt->disableSAX = state;
                ctxt->instate = instate;

		if (RAW == 0) {
		    xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                    goto error;
		}
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                SKIP(3);
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (ISSML || (NXT(2) == '>'))) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP_MLI(3);
        } else {
            const xmlChar *check = CUR_PTR;
            unsigned int cons = ctxt->input->consumed;

            xmlParseMarkupDecl(ctxt);

            if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
                xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        }

        if (depth == 0)
            break;

        SKIP_BLANKS;
        GROW;
    }

error:
    xmlFree(inputIds);
    RETURN();
}